

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void libyuv::ScaleAddCols2_16_C
               (int dst_width,int boxheight,int x,int dx,uint32_t *src_ptr,uint16_t *dst_ptr)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  int iboxwidth;
  ulong uVar5;
  int aiStack_20040 [32766];
  int scaletbl [2];
  
  iVar3 = dx >> 0x10;
  iVar1 = 1;
  if (1 < iVar3) {
    iVar1 = iVar3;
  }
  uVar5 = 0;
  scaletbl[0] = (int)(0x10000 / (long)(iVar1 * boxheight));
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  scaletbl[1] = (int)(0x10000 / (long)((iVar1 + 1) * boxheight));
  uVar4 = (ulong)(uint)dst_width;
  if (dst_width < 1) {
    uVar4 = uVar5;
  }
  for (; (int)uVar4 != (int)uVar5; uVar5 = uVar5 + 1) {
    iVar1 = x >> 0x10;
    x = x + dx;
    iboxwidth = (x >> 0x10) - iVar1;
    if (iboxwidth < 2) {
      iboxwidth = 1;
    }
    uVar2 = SumPixels_16(iboxwidth,src_ptr + iVar1);
    dst_ptr[uVar5] = (uint16_t)(uVar2 * scaletbl[iboxwidth - iVar3] >> 0x10);
  }
  return;
}

Assistant:

static void ScaleAddCols2_16_C(int dst_width,
                               int boxheight,
                               int x,
                               int dx,
                               const uint32_t* src_ptr,
                               uint16_t* dst_ptr) {
  int i;
  int scaletbl[2];
  int minboxwidth = dx >> 16;
  int boxwidth;
  scaletbl[0] = 65536 / (MIN1(minboxwidth) * boxheight);
  scaletbl[1] = 65536 / (MIN1(minboxwidth + 1) * boxheight);
  for (i = 0; i < dst_width; ++i) {
    int ix = x >> 16;
    x += dx;
    boxwidth = MIN1((x >> 16) - ix);
    *dst_ptr++ = SumPixels_16(boxwidth, src_ptr + ix) *
                     scaletbl[boxwidth - minboxwidth] >>
                 16;
  }
}